

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * __thiscall
cmQtAutoGen::Quoted_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoGen *this,string_view text)

{
  char local_7a [2];
  const_iterator local_78;
  pair<const_char_*,_const_char_*> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::pair<const_char_*,_const_char_*>_> *__range1;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string res;
  string_view text_local;
  
  res.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)local_40,
             (basic_string_view<char,_std::char_traits<char>_> *)((long)&res.field_2 + 8),&local_41)
  ;
  std::allocator<char>::~allocator(&local_41);
  __begin1 = (const_iterator)&Quoted::replacements;
  __end1 = std::initializer_list<std::pair<const_char_*,_const_char_*>_>::begin
                     (&Quoted::replacements);
  pair = std::initializer_list<std::pair<const_char_*,_const_char_*>_>::end(&Quoted::replacements);
  for (; __end1 != pair; __end1 = __end1 + 1) {
    local_78 = __end1;
    cmsys::SystemTools::ReplaceString((string *)local_40,__end1->first,__end1->second);
  }
  local_7a[1] = 0x22;
  local_7a[0] = '\"';
  cmStrCat<char,std::__cxx11::string&,char>
            (__return_storage_ptr__,local_7a + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,local_7a)
  ;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(cm::string_view text)
{
  static std::initializer_list<std::pair<const char*, const char*>> const
    replacements = { { "\\", "\\\\" }, { "\"", "\\\"" }, { "\a", "\\a" },
                     { "\b", "\\b" },  { "\f", "\\f" },  { "\n", "\\n" },
                     { "\r", "\\r" },  { "\t", "\\t" },  { "\v", "\\v" } };

  std::string res(text);
  for (auto const& pair : replacements) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  return cmStrCat('"', res, '"');
}